

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall randomx::JitCompilerX86::h_CBRANCH(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  uint j;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  bVar1 = instr->dst;
  iVar7 = this->codePos;
  iVar5 = ((this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)this->registerUsage[bVar1] + 1] - iVar7) + -0x10;
  if ((BranchesWithin32B == '\x01') &&
     (0x1f < (iVar7 + (uint)(iVar5 < -0x80) * 4 + 0x10 ^ iVar7 + 7U))) {
    uVar6 = 0x20 - (iVar7 + 7U & 0x1f);
    iVar5 = iVar5 - uVar6;
    memcpy(this->code + iVar7,&JMP_ALIGN_PREFIX + uVar6 * 0x10,(ulong)uVar6);
    iVar7 = uVar6 + this->codePos;
    this->codePos = iVar7;
  }
  puVar2 = this->code;
  (puVar2 + iVar7)[0] = 'I';
  (puVar2 + iVar7)[1] = 0x81;
  iVar7 = this->codePos + 2;
  this->codePos = iVar7;
  uVar3 = bVar1 - 0x40;
  this->code[iVar7] = uVar3;
  iVar7 = this->codePos;
  this->codePos = iVar7 + 1;
  bVar1 = instr->mod >> 4;
  *(uint32_t *)(this->code + (long)iVar7 + 1) = ~(0x80 << bVar1) & (0x100 << bVar1 | instr->imm32);
  iVar7 = this->codePos + 4;
  this->codePos = iVar7;
  puVar2 = this->code;
  (puVar2 + iVar7)[0] = 'I';
  (puVar2 + iVar7)[1] = 0xf7;
  iVar7 = this->codePos + 2;
  this->codePos = iVar7;
  this->code[iVar7] = uVar3;
  iVar7 = this->codePos;
  this->codePos = iVar7 + 1;
  *(int *)(this->code + (long)iVar7 + 1) = 0xff00 << bVar1;
  iVar7 = this->codePos + 4;
  this->codePos = iVar7;
  if (iVar5 < -0x80) {
    puVar2 = this->code + iVar7;
    puVar2[0] = '\x0f';
    puVar2[1] = 0x84;
    iVar7 = this->codePos + 2;
    this->codePos = iVar7;
    *(int *)(this->code + iVar7) = iVar5 + -4;
    iVar7 = 4;
  }
  else {
    this->code[iVar7] = 't';
    iVar7 = this->codePos;
    this->codePos = iVar7 + 1;
    this->code[(long)iVar7 + 1] = (uint8_t)iVar5;
    iVar7 = 1;
  }
  this->codePos = this->codePos + iVar7;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    this->registerUsage[lVar4] = i;
  }
  return;
}

Assistant:

void JitCompilerX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;

		int32_t jmp_offset = instructionOffsets[target] - (codePos + 16);

		if (BranchesWithin32B) {
			const uint32_t branch_begin = static_cast<uint32_t>(codePos + 7);
			const uint32_t branch_end = static_cast<uint32_t>(branch_begin + ((jmp_offset >= -128) ? 9 : 13));

			// If the jump crosses or touches 32-byte boundary, align it
			if ((branch_begin ^ branch_end) >= 32) {
				const uint32_t alignment_size = 32 - (branch_begin & 31);
				jmp_offset -= alignment_size;
				emit(JMP_ALIGN_PREFIX[alignment_size], alignment_size);
			}
		}

		emit(REX_ADD_I);
		emitByte(0xc0 + reg);
		const int shift = instr.getModCond() + ConditionOffset;
		uint32_t imm = instr.getImm32() | (1UL << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1UL << (shift - 1));
		emit32(imm);

		emit(REX_TEST);
		emitByte(0xc0 + reg);
		emit32(ConditionMask << shift);

		if (jmp_offset >= -128) {
			emitByte(JZ_SHORT);
			emitByte(jmp_offset);
		}
		else {
			emit(JZ);
			emit32(jmp_offset - 4);
		}

		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}